

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O0

void compute_response_layer_unconditional(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  int cols;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int cols_00;
  int iVar9;
  int iVar10;
  int iVar11;
  integral_image *in_RSI;
  int *in_RDI;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  int j;
  int ind;
  int i;
  float inv_area;
  int border;
  int lobe;
  int width;
  int height;
  int filter_size;
  int step;
  bool *laplacian;
  float *response;
  int y;
  int x;
  float Dxy;
  float Dyy;
  float Dxx;
  int local_60;
  int local_5c;
  int local_58;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  lVar4 = *(long *)(in_RDI + 4);
  lVar5 = *(long *)(in_RDI + 6);
  iVar1 = in_RDI[3];
  cols = *in_RDI;
  iVar2 = in_RDI[2];
  iVar3 = in_RDI[1];
  cols_00 = cols / 3;
  iVar9 = (cols + -1) / 2;
  fVar12 = 1.0 / (float)(cols * cols);
  local_5c = 0;
  for (local_58 = 0; local_58 < iVar2; local_58 = local_58 + 1) {
    for (local_60 = 0; local_60 < iVar3; local_60 = local_60 + 1) {
      iVar10 = local_58 * iVar1;
      iVar11 = local_60 * iVar1;
      fVar13 = box_integral_unconditional
                         (in_RSI,(iVar10 - cols_00) + 1,iVar11 - iVar9,cols_00 * 2 + -1,cols);
      auVar18._0_4_ =
           box_integral_unconditional
                     (in_RSI,(iVar10 - cols_00) + 1,iVar11 - cols_00 / 2,cols_00 * 2 + -1,cols_00);
      auVar18._4_60_ = extraout_var;
      auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar18._0_16_,ZEXT416((uint)fVar13));
      fVar13 = box_integral_unconditional
                         (in_RSI,iVar10 - iVar9,(iVar11 - cols_00) + 1,cols,cols_00 * 2 + -1);
      auVar19._0_4_ =
           box_integral_unconditional
                     (in_RSI,iVar10 - cols_00 / 2,(iVar11 - cols_00) + 1,cols_00,cols_00 * 2 + -1);
      auVar19._4_60_ = extraout_var_00;
      auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar19._0_16_,ZEXT416((uint)fVar13));
      fVar14 = box_integral_unconditional(in_RSI,iVar10 - cols_00,iVar11 + 1,cols_00,cols_00);
      fVar15 = box_integral_unconditional(in_RSI,iVar10 + 1,iVar11 - cols_00,cols_00,cols_00);
      fVar16 = box_integral_unconditional(in_RSI,iVar10 - cols_00,iVar11 - cols_00,cols_00,cols_00);
      fVar17 = box_integral_unconditional(in_RSI,iVar10 + 1,iVar11 + 1,cols_00,cols_00);
      fVar13 = fVar12 * auVar7._0_4_;
      fVar6 = fVar12 * auVar8._0_4_;
      fVar14 = fVar12 * (((fVar14 + fVar15) - fVar16) - fVar17);
      auVar7 = vfmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)fVar13),
                               ZEXT416((uint)-(fVar14 * 0.81 * fVar14)));
      *(int *)(lVar4 + (long)local_5c * 4) = auVar7._0_4_;
      *(bool *)(lVar5 + local_5c) = 0.0 <= fVar13 + fVar6;
      local_5c = local_5c + 1;
    }
  }
  return;
}

Assistant:

void compute_response_layer_unconditional(struct response_layer *layer, struct integral_image *iimage) {
    /*
    optimizations:
        - uses padded image and therefore box_integral that is completely unconditional
    */
    float Dxx, Dyy, Dxy;
    int x, y;

    float *response = layer->response;
    bool *laplacian = layer->laplacian;

    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size/3;
    int border = (filter_size-1)/2;
    float inv_area = 1.f/(filter_size*filter_size);
    for (int i = 0, ind = 0; i < height; ++i) {
        for (int j = 0; j < width; ++j, ind++) {
            // Image coordinates
            x = i*step;
            y = j*step;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            Dyy = box_integral_unconditional(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                    - 3 * box_integral_unconditional(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);
            Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            // response[ind] -= 0.81f * Dxy * Dxy;
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;
            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0);
        }
    }

}